

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_4,_2>,_tcu::Vector<double,_4>,_tcu::Vector<double,_2>_>::call
          (binary<tcu::Matrix<double,_4,_2>,_tcu::Vector<double,_4>,_tcu::Vector<double,_2>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  int row_1;
  GLdouble *data;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  uint uVar10;
  Vector<double,_2> arg_2;
  Vector<double,_4> arg_1;
  Matrix<double,_4,_2> result;
  undefined8 local_a8 [9];
  undefined1 local_60 [64];
  
  lVar8 = 0;
  GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  puVar5 = local_a8;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar10 = 0x3ff00000;
      if (lVar8 != lVar7) {
        uVar10 = 0;
      }
      *(ulong *)((long)puVar5 + lVar7) = (ulong)uVar10 << 0x20;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 == 0x20);
    lVar6 = lVar6 + 1;
    puVar5 = puVar5 + 1;
    lVar8 = lVar8 + 0x20;
  } while (lVar6 != 4);
  puVar9 = local_60;
  (*pcVar1)(puVar9);
  puVar5 = local_a8;
  lVar6 = 0;
  do {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)puVar5 + lVar8) = *(undefined8 *)(puVar9 + lVar8);
      lVar8 = lVar8 + 0x20;
    } while (lVar8 == 0x20);
    lVar6 = lVar6 + 1;
    puVar5 = puVar5 + 1;
    puVar9 = puVar9 + 8;
  } while (lVar6 != 4);
  lVar6 = 0;
  do {
    uVar2 = *(undefined8 *)((long)local_a8 + lVar6);
    uVar3 = *(undefined8 *)((long)local_a8 + lVar6 + 8);
    uVar4 = *(undefined8 *)((long)local_a8 + lVar6 + 0x18);
    puVar5 = (undefined8 *)((long)result_dst + lVar6 + 0x10);
    *puVar5 = *(undefined8 *)((long)local_a8 + lVar6 + 0x10);
    puVar5[1] = uVar4;
    *(undefined8 *)((long)result_dst + lVar6) = uVar2;
    ((undefined8 *)((long)result_dst + lVar6))[1] = uVar3;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 == 0x20);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}